

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::init
          (Texture2DLodControlCase *this,EVP_PKEY_CTX *ctx)

{
  int a;
  Texture2D *this_00;
  RenderContext *context;
  Texture2D *pTVar1;
  PixelBufferAccess *access;
  RGBA local_50;
  Vec4 local_4c;
  uint local_3c;
  uint local_38;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  int local_18;
  undefined4 local_14;
  int numLevels;
  deUint32 format;
  Texture2DLodControlCase *this_local;
  
  local_14 = 0x8058;
  _numLevels = this;
  a = de::max<int>(this->m_texWidth,this->m_texHeight);
  local_18 = ::deLog2Floor32(a);
  local_18 = local_18 + 1;
  this_00 = (Texture2D *)operator_new(0x70);
  context = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::Texture2D::Texture2D(this_00,context,0x8058,this->m_texWidth,this->m_texHeight);
  this->m_texture = this_00;
  for (inc = 0; (int)inc < local_18; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(local_18 + -1));
    rgb = ::deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_3c = rgb << 0x10 | color * 0x100;
    local_38 = local_3c | 0xff;
    local_3c = local_3c | 0xff0000ff;
    pTVar1 = glu::Texture2D::getRefTexture(this->m_texture);
    tcu::Texture2D::allocLevel(pTVar1,inc);
    pTVar1 = glu::Texture2D::getRefTexture(this->m_texture);
    access = tcu::TextureLevelPyramid::getLevel(&pTVar1->super_TextureLevelPyramid,inc);
    tcu::RGBA::RGBA(&local_50,local_3c);
    tcu::RGBA::toVec((RGBA *)&local_4c);
    tcu::clear(access,&local_4c);
  }
  return inc;
}

Assistant:

void Texture2DLodControlCase::init (void)
{
	const deUint32	format		= GL_RGBA8;
	int				numLevels	= deLog2Floor32(de::max(m_texWidth, m_texHeight))+1;

	m_texture = new glu::Texture2D(m_context.getRenderContext(), format, m_texWidth, m_texHeight);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (inc << 16) | (dec << 8) | 0xff;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec());
	}
}